

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_3a8b04::Handlers::initHandlers(Handlers *this)

{
  JSONHandler *this_00;
  logic_error *this_01;
  allocator<char> local_14d9;
  undefined1 local_14d8 [16];
  code *local_14c8;
  code *local_14c0;
  bare_handler_t local_14b8;
  json_handler_t local_1498;
  bare_handler_t local_1478;
  json_handler_t local_1458;
  bare_handler_t local_1438;
  json_handler_t local_1418;
  bare_handler_t local_13f8;
  json_handler_t local_13d8;
  bare_handler_t local_13b8;
  json_handler_t local_1398;
  bare_handler_t local_1378;
  json_handler_t local_1358;
  bare_handler_t local_1338;
  json_handler_t local_1318;
  bare_handler_t local_12f8;
  json_handler_t local_12d8;
  bare_handler_t local_12b8;
  json_handler_t local_1298;
  bare_handler_t local_1278;
  json_handler_t local_1258;
  bare_handler_t local_1238;
  json_handler_t local_1218;
  bare_handler_t local_11f8;
  json_handler_t local_11d8;
  bare_handler_t local_11b8;
  json_handler_t local_1198;
  bare_handler_t local_1178;
  json_handler_t local_1158;
  bare_handler_t local_1138;
  json_handler_t local_1118;
  bare_handler_t local_10f8;
  json_handler_t local_10d8;
  bare_handler_t local_10b8;
  json_handler_t local_1098;
  bare_handler_t local_1078;
  json_handler_t local_1058;
  bare_handler_t local_1038;
  json_handler_t local_1018;
  _Any_data local_ff8;
  code *local_fe8;
  code *local_fe0;
  _Any_data local_fd0;
  code *local_fc0;
  code *local_fb8;
  _Any_data local_fb0;
  code *local_fa0;
  code *local_f98;
  _Any_data local_f90;
  code *local_f80;
  code *local_f78;
  _Any_data local_f70;
  code *local_f60;
  code *local_f58;
  _Any_data local_f50;
  code *local_f40;
  code *local_f38;
  _Any_data local_f30;
  code *local_f20;
  code *local_f18;
  _Any_data local_f10;
  code *local_f00;
  code *local_ef8;
  _Any_data local_ef0;
  code *local_ee0;
  code *local_ed8;
  _Any_data local_ed0;
  code *local_ec0;
  code *local_eb8;
  _Any_data local_eb0;
  code *local_ea0;
  code *local_e98;
  _Any_data local_e90;
  code *local_e80;
  code *local_e78;
  _Any_data local_e70;
  code *local_e60;
  code *local_e58;
  _Any_data local_e50;
  code *local_e40;
  code *local_e38;
  _Any_data local_e30;
  code *local_e20;
  code *local_e18;
  _Any_data local_e10;
  code *local_e00;
  code *local_df8;
  _Any_data local_df0;
  code *local_de0;
  code *local_dd8;
  _Any_data local_dd0;
  code *local_dc0;
  code *local_db8;
  _Any_data local_db0;
  code *local_da0;
  code *local_d98;
  _Any_data local_d90;
  code *local_d80;
  code *local_d78;
  _Any_data local_d70;
  code *local_d60;
  code *local_d58;
  _Any_data local_d50;
  code *local_d40;
  code *local_d38;
  _Any_data local_d30;
  code *local_d20;
  code *local_d18;
  _Any_data local_d10;
  code *local_d00;
  code *local_cf8;
  _Any_data local_cf0;
  code *local_ce0;
  code *local_cd8;
  _Any_data local_cd0;
  code *local_cc0;
  code *local_cb8;
  _Any_data local_cb0;
  code *local_ca0;
  code *local_c98;
  _Any_data local_c90;
  code *local_c80;
  code *local_c78;
  _Any_data local_c70;
  code *local_c60;
  code *local_c58;
  _Any_data local_c50;
  code *local_c40;
  code *local_c38;
  _Any_data local_c30;
  code *local_c20;
  code *local_c18;
  _Any_data local_c10;
  code *local_c00;
  code *local_bf8;
  _Any_data local_bf0;
  code *local_be0;
  code *local_bd8;
  _Any_data local_bd0;
  code *local_bc0;
  code *local_bb8;
  _Any_data local_bb0;
  code *local_ba0;
  code *local_b98;
  _Any_data local_b90;
  code *local_b80;
  code *local_b78;
  _Any_data local_b70;
  code *local_b60;
  code *local_b58;
  _Any_data local_b50;
  code *local_b40;
  code *local_b38;
  _Any_data local_b30;
  code *local_b20;
  code *local_b18;
  _Any_data local_b10;
  code *local_b00;
  code *local_af8;
  _Any_data local_af0;
  code *local_ae0;
  code *local_ad8;
  _Any_data local_ad0;
  code *local_ac0;
  code *local_ab8;
  _Any_data local_ab0;
  code *local_aa0;
  code *local_a98;
  _Any_data local_a90;
  code *local_a80;
  code *local_a78;
  _Any_data local_a70;
  code *local_a60;
  code *local_a58;
  _Any_data local_a50;
  code *local_a40;
  code *local_a38;
  _Any_data local_a30;
  code *local_a20;
  code *local_a18;
  _Any_data local_a10;
  code *local_a00;
  code *local_9f8;
  _Any_data local_9f0;
  code *local_9e0;
  code *local_9d8;
  _Any_data local_9d0;
  code *local_9c0;
  code *local_9b8;
  _Any_data local_9b0;
  code *local_9a0;
  code *local_998;
  _Any_data local_990;
  code *local_980;
  code *local_978;
  _Any_data local_970;
  code *local_960;
  code *local_958;
  _Any_data local_950;
  code *local_940;
  code *local_938;
  _Any_data local_930;
  code *local_920;
  code *local_918;
  _Any_data local_910;
  code *local_900;
  code *local_8f8;
  _Any_data local_8f0;
  code *local_8e0;
  code *local_8d8;
  _Any_data local_8d0;
  code *local_8c0;
  code *local_8b8;
  _Any_data local_8b0;
  code *local_8a0;
  code *local_898;
  _Any_data local_890;
  code *local_880;
  code *local_878;
  _Any_data local_870;
  code *local_860;
  code *local_858;
  _Any_data local_850;
  code *local_840;
  code *local_838;
  _Any_data local_830;
  code *local_820;
  code *local_818;
  _Any_data local_810;
  code *local_800;
  code *local_7f8;
  _Any_data local_7f0;
  code *local_7e0;
  code *local_7d8;
  _Any_data local_7d0;
  code *local_7c0;
  code *local_7b8;
  _Any_data local_7b0;
  code *local_7a0;
  code *local_798;
  _Any_data local_790;
  code *local_780;
  code *local_778;
  _Any_data local_770;
  code *local_760;
  code *local_758;
  _Any_data local_750;
  code *local_740;
  code *local_738;
  _Any_data local_730;
  code *local_720;
  code *local_718;
  _Any_data local_710;
  code *local_700;
  code *local_6f8;
  _Any_data local_6f0;
  code *local_6e0;
  code *local_6d8;
  _Any_data local_6d0;
  code *local_6c0;
  code *local_6b8;
  _Any_data local_6b0;
  code *local_6a0;
  code *local_698;
  _Any_data local_690;
  code *local_680;
  code *local_678;
  _Any_data local_670;
  code *local_660;
  code *local_658;
  _Any_data local_650;
  code *local_640;
  code *local_638;
  _Any_data local_630;
  code *local_620;
  code *local_618;
  _Any_data local_610;
  code *local_600;
  code *local_5f8;
  _Any_data local_5f0;
  code *local_5e0;
  code *local_5d8;
  _Any_data local_5d0;
  code *local_5c0;
  code *local_5b8;
  _Any_data local_5b0;
  code *local_5a0;
  code *local_598;
  _Any_data local_590;
  code *local_580;
  code *local_578;
  _Any_data local_570;
  code *local_560;
  code *local_558;
  _Any_data local_550;
  code *local_540;
  code *local_538;
  _Any_data local_530;
  code *local_520;
  code *local_518;
  _Any_data local_510;
  code *local_500;
  code *local_4f8;
  _Any_data local_4f0;
  code *local_4e0;
  code *local_4d8;
  _Any_data local_4d0;
  code *local_4c0;
  code *local_4b8;
  _Any_data local_4b0;
  code *local_4a0;
  code *local_498;
  _Any_data local_490;
  code *local_480;
  code *local_478;
  _Any_data local_470;
  code *local_460;
  code *local_458;
  _Any_data local_450;
  code *local_440;
  code *local_438;
  _Any_data local_430;
  code *local_420;
  code *local_418;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  _Any_data local_3f0;
  code *local_3e0;
  code *local_3d8;
  _Any_data local_3d0;
  code *local_3c0;
  code *local_3b8;
  _Any_data local_3b0;
  code *local_3a0;
  code *local_398;
  _Any_data local_390;
  code *local_380;
  code *local_378;
  _Any_data local_370;
  code *local_360;
  code *local_358;
  _Any_data local_350;
  code *local_340;
  code *local_338;
  _Any_data local_330;
  code *local_320;
  code *local_318;
  _Any_data local_310;
  code *local_300;
  code *local_2f8;
  _Any_data local_2f0;
  code *local_2e0;
  code *local_2d8;
  _Any_data local_2d0;
  code *local_2c0;
  code *local_2b8;
  _Any_data local_2b0;
  code *local_2a0;
  code *local_298;
  _Any_data local_290;
  code *local_280;
  code *local_278;
  _Any_data local_270;
  code *local_260;
  code *local_258;
  _Any_data local_250;
  code *local_240;
  code *local_238;
  _Any_data local_230;
  code *local_220;
  code *local_218;
  _Any_data local_210;
  code *local_200;
  code *local_1f8;
  _Any_data local_1f0;
  code *local_1e0;
  code *local_1d8;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  _Any_data local_190;
  code *local_180;
  code *local_178;
  _Any_data local_170;
  code *local_160;
  code *local_158;
  _Any_data local_150;
  code *local_140;
  code *local_138;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  _Any_data local_110;
  code *local_100;
  code *local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  _Any_data local_90;
  code *local_80;
  code *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  std::make_shared<JSONHandler>();
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,(shared_ptr<JSONHandler> *)local_14d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_14d8 + 8));
  this_00 = (this->json_handlers).
            super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1].
            super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this->jh = this_00;
  local_ff8._M_unused._M_object = (void *)0x0;
  local_ff8._8_8_ = 0;
  local_fe0 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:106:9)>
              ::_M_invoke;
  local_fe8 = std::
              _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:106:9)>
              ::_M_manager;
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:107:9)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:107:9)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  JSONHandler::addDictHandlers(this_00,(json_handler_t *)&local_ff8,(void_handler_t *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_ff8);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"inputFile",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:246:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:246:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"password",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:252:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:252:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"passwordFile",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:30:14)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:30:14)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_50);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"empty",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:258:13)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:258:13)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addBare(this,(bare_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"jsonInput",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:36:9)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:36:9)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"outputFile",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:264:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:264:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"replaceInput",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:270:13)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:270:13)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addBare(this,(bare_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"qdf",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_90._8_8_ = 0;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:45:9)>
             ::_M_invoke;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:45:9)>
             ::_M_manager;
  local_90._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_90);
  std::_Function_base::~_Function_base((_Function_base *)&local_90);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"preserveUnreferenced",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:48:9)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:48:9)>
             ::_M_manager;
  local_b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"newlineBeforeEndstream",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:51:9)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:51:9)>
             ::_M_manager;
  local_d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"normalizeContent",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_f0._8_8_ = 0;
  local_d8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:54:30)>
             ::_M_invoke;
  local_e0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:54:30)>
             ::_M_manager;
  local_f0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"streamData",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_110._8_8_ = 0;
  local_f8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:57:39)>
             ::_M_invoke;
  local_100 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:57:39)>
              ::_M_manager;
  local_110._M_unused._M_object = this;
  addChoices(this,initHandlers::stream_data_choices,true,(param_handler_t *)&local_110);
  std::_Function_base::~_Function_base((_Function_base *)&local_110);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"compressStreams",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_130._8_8_ = 0;
  local_118 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:60:30)>
              ::_M_invoke;
  local_120 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:60:30)>
              ::_M_manager;
  local_130._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_130);
  std::_Function_base::~_Function_base((_Function_base *)&local_130);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"recompressFlate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_150._8_8_ = 0;
  local_138 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:63:9)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:63:9)>
              ::_M_manager;
  local_150._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_150);
  std::_Function_base::~_Function_base((_Function_base *)&local_150);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"decodeLevel",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_170._8_8_ = 0;
  local_158 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:66:40)>
              ::_M_invoke;
  local_160 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:66:40)>
              ::_M_manager;
  local_170._M_unused._M_object = this;
  addChoices(this,initHandlers::decode_level_choices,true,(param_handler_t *)&local_170);
  std::_Function_base::~_Function_base((_Function_base *)&local_170);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"decrypt",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_190._8_8_ = 0;
  local_178 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:69:9)>
              ::_M_invoke;
  local_180 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:69:9)>
              ::_M_manager;
  local_190._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_190);
  std::_Function_base::~_Function_base((_Function_base *)&local_190);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"deterministicId",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_1b0._8_8_ = 0;
  local_198 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:72:9)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:72:9)>
              ::_M_manager;
  local_1b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"staticAesIv",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_1d0._8_8_ = 0;
  local_1b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:75:9)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:75:9)>
              ::_M_manager;
  local_1d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"staticId",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_1f0._8_8_ = 0;
  local_1d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:78:9)>
              ::_M_invoke;
  local_1e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:78:9)>
              ::_M_manager;
  local_1f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_1f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"noOriginalObjectIds",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_210._8_8_ = 0;
  local_1f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:81:9)>
              ::_M_invoke;
  local_200 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:81:9)>
              ::_M_manager;
  local_210._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_210);
  std::_Function_base::~_Function_base((_Function_base *)&local_210);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"copyEncryption",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_230._8_8_ = 0;
  local_218 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:84:14)>
              ::_M_invoke;
  local_220 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:84:14)>
              ::_M_manager;
  local_230._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_230);
  std::_Function_base::~_Function_base((_Function_base *)&local_230);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"encryptionFilePassword",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_250._8_8_ = 0;
  local_238 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:87:14)>
              ::_M_invoke;
  local_240 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:87:14)>
              ::_M_manager;
  local_250._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_250);
  std::_Function_base::~_Function_base((_Function_base *)&local_250);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"linearize",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_270._8_8_ = 0;
  local_258 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:90:9)>
              ::_M_invoke;
  local_260 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:90:9)>
              ::_M_manager;
  local_270._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_270);
  std::_Function_base::~_Function_base((_Function_base *)&local_270);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"linearizePass1",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_290._8_8_ = 0;
  local_278 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:93:14)>
              ::_M_invoke;
  local_280 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:93:14)>
              ::_M_manager;
  local_290._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_290);
  std::_Function_base::~_Function_base((_Function_base *)&local_290);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"objectStreams",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_2b0._8_8_ = 0;
  local_298 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:96:42)>
              ::_M_invoke;
  local_2a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:96:42)>
              ::_M_manager;
  local_2b0._M_unused._M_object = this;
  addChoices(this,initHandlers::object_streams_choices,true,(param_handler_t *)&local_2b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"minVersion",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_2d0._8_8_ = 0;
  local_2b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:99:14)>
              ::_M_invoke;
  local_2c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:99:14)>
              ::_M_manager;
  local_2d0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_2d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"forceVersion",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_2f0._8_8_ = 0;
  local_2d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:102:14)>
              ::_M_invoke;
  local_2e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:102:14)>
              ::_M_manager;
  local_2f0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_2f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"progress",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_310._8_8_ = 0;
  local_2f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:105:9)>
              ::_M_invoke;
  local_300 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:105:9)>
              ::_M_manager;
  local_310._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_310);
  std::_Function_base::~_Function_base((_Function_base *)&local_310);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"splitPages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_330._8_8_ = 0;
  local_318 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:108:14)>
              ::_M_invoke;
  local_320 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:108:14)>
              ::_M_manager;
  local_330._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_330);
  std::_Function_base::~_Function_base((_Function_base *)&local_330);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"jsonOutput",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_350._8_8_ = 0;
  local_338 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:111:40)>
              ::_M_invoke;
  local_340 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:111:40)>
              ::_M_manager;
  local_350._M_unused._M_object = this;
  addChoices(this,initHandlers::json_output_choices,false,(param_handler_t *)&local_350);
  std::_Function_base::~_Function_base((_Function_base *)&local_350);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"removeRestrictions",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_370._8_8_ = 0;
  local_358 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:114:9)>
              ::_M_invoke;
  local_360 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:114:9)>
              ::_M_manager;
  local_370._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_370);
  std::_Function_base::~_Function_base((_Function_base *)&local_370);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"encrypt",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1018,this,0x18f86e);
  bindBare(&local_1038,this,0x18fa78);
  beginDict(this,&local_1018,&local_1038);
  std::_Function_base::~_Function_base(&local_1038.super__Function_base);
  std::_Function_base::~_Function_base(&local_1018.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"userPassword",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  ignoreItem(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"ownerPassword",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  ignoreItem(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"Bits",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"40bit",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1058,this,0x18faae);
  bindBare(&local_1078,this,0x18fab0);
  beginDict(this,&local_1058,&local_1078);
  std::_Function_base::~_Function_base(&local_1078.super__Function_base);
  std::_Function_base::~_Function_base(&local_1058.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"annotate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_390._8_8_ = 0;
  local_378 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:129:30)>
              ::_M_invoke;
  local_380 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:129:30)>
              ::_M_manager;
  local_390._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_390);
  std::_Function_base::~_Function_base((_Function_base *)&local_390);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"extract",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_3b0._8_8_ = 0;
  local_398 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:132:30)>
              ::_M_invoke;
  local_3a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:132:30)>
              ::_M_manager;
  local_3b0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_3b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_3b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"modify",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_3d0._8_8_ = 0;
  local_3b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:135:37)>
              ::_M_invoke;
  local_3c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:135:37)>
              ::_M_manager;
  local_3d0._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_3d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_3d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"print",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_3f0._8_8_ = 0;
  local_3d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:138:36)>
              ::_M_invoke;
  local_3e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:138:36)>
              ::_M_manager;
  local_3f0._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_3f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_3f0);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"128bit",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1098,this,0x18fab2);
  bindBare(&local_10b8,this,0x18fab4);
  beginDict(this,&local_1098,&local_10b8);
  std::_Function_base::~_Function_base(&local_10b8.super__Function_base);
  std::_Function_base::~_Function_base(&local_1098.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"accessibility",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_410._8_8_ = 0;
  local_3f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:144:30)>
              ::_M_invoke;
  local_400 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:144:30)>
              ::_M_manager;
  local_410._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_410);
  std::_Function_base::~_Function_base((_Function_base *)&local_410);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"annotate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_430._8_8_ = 0;
  local_418 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:147:30)>
              ::_M_invoke;
  local_420 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:147:30)>
              ::_M_manager;
  local_430._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_430);
  std::_Function_base::~_Function_base((_Function_base *)&local_430);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"assemble",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_450._8_8_ = 0;
  local_438 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:150:30)>
              ::_M_invoke;
  local_440 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:150:30)>
              ::_M_manager;
  local_450._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_450);
  std::_Function_base::~_Function_base((_Function_base *)&local_450);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"cleartextMetadata",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_470._8_8_ = 0;
  local_458 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:153:9)>
              ::_M_invoke;
  local_460 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:153:9)>
              ::_M_manager;
  local_470._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_470);
  std::_Function_base::~_Function_base((_Function_base *)&local_470);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"extract",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_490._8_8_ = 0;
  local_478 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:156:30)>
              ::_M_invoke;
  local_480 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:156:30)>
              ::_M_manager;
  local_490._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_490);
  std::_Function_base::~_Function_base((_Function_base *)&local_490);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"form",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_4b0._8_8_ = 0;
  local_498 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:159:30)>
              ::_M_invoke;
  local_4a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:159:30)>
              ::_M_manager;
  local_4b0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_4b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_4b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"modifyOther",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_4d0._8_8_ = 0;
  local_4b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:162:30)>
              ::_M_invoke;
  local_4c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:162:30)>
              ::_M_manager;
  local_4d0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_4d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_4d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"modify",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_4f0._8_8_ = 0;
  local_4d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:165:37)>
              ::_M_invoke;
  local_4e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:165:37)>
              ::_M_manager;
  local_4f0._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_4f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_4f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"print",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_510._8_8_ = 0;
  local_4f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:168:36)>
              ::_M_invoke;
  local_500 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:168:36)>
              ::_M_manager;
  local_510._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_510);
  std::_Function_base::~_Function_base((_Function_base *)&local_510);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"forceV4",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_530._8_8_ = 0;
  local_518 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:171:9)>
              ::_M_invoke;
  local_520 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:171:9)>
              ::_M_manager;
  local_530._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_530);
  std::_Function_base::~_Function_base((_Function_base *)&local_530);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"useAes",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_550._8_8_ = 0;
  local_538 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:174:30)>
              ::_M_invoke;
  local_540 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:174:30)>
              ::_M_manager;
  local_550._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_550);
  std::_Function_base::~_Function_base((_Function_base *)&local_550);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"256bit",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_10d8,this,0x18fab6);
  bindBare(&local_10f8,this,0x18fab8);
  beginDict(this,&local_10d8,&local_10f8);
  std::_Function_base::~_Function_base(&local_10f8.super__Function_base);
  std::_Function_base::~_Function_base(&local_10d8.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"accessibility",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_570._8_8_ = 0;
  local_558 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:180:30)>
              ::_M_invoke;
  local_560 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:180:30)>
              ::_M_manager;
  local_570._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_570);
  std::_Function_base::~_Function_base((_Function_base *)&local_570);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"annotate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_590._8_8_ = 0;
  local_578 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:183:30)>
              ::_M_invoke;
  local_580 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:183:30)>
              ::_M_manager;
  local_590._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_590);
  std::_Function_base::~_Function_base((_Function_base *)&local_590);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"assemble",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_5b0._8_8_ = 0;
  local_598 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:186:30)>
              ::_M_invoke;
  local_5a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:186:30)>
              ::_M_manager;
  local_5b0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_5b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_5b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"cleartextMetadata",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_5d0._8_8_ = 0;
  local_5b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:189:9)>
              ::_M_invoke;
  local_5c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:189:9)>
              ::_M_manager;
  local_5d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_5d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_5d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"extract",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_5f0._8_8_ = 0;
  local_5d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:192:30)>
              ::_M_invoke;
  local_5e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:192:30)>
              ::_M_manager;
  local_5f0._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_5f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_5f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"form",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_610._8_8_ = 0;
  local_5f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:195:30)>
              ::_M_invoke;
  local_600 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:195:30)>
              ::_M_manager;
  local_610._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_610);
  std::_Function_base::~_Function_base((_Function_base *)&local_610);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"modifyOther",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_630._8_8_ = 0;
  local_618 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:198:30)>
              ::_M_invoke;
  local_620 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:198:30)>
              ::_M_manager;
  local_630._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_630);
  std::_Function_base::~_Function_base((_Function_base *)&local_630);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"modify",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_650._8_8_ = 0;
  local_638 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:201:37)>
              ::_M_invoke;
  local_640 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:201:37)>
              ::_M_manager;
  local_650._M_unused._M_object = this;
  addChoices(this,initHandlers::modify128_choices,true,(param_handler_t *)&local_650);
  std::_Function_base::~_Function_base((_Function_base *)&local_650);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"print",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_670._8_8_ = 0;
  local_658 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:204:36)>
              ::_M_invoke;
  local_660 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:204:36)>
              ::_M_manager;
  local_670._M_unused._M_object = this;
  addChoices(this,initHandlers::print128_choices,true,(param_handler_t *)&local_670);
  std::_Function_base::~_Function_base((_Function_base *)&local_670);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"allowInsecure",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_690._8_8_ = 0;
  local_678 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:207:9)>
              ::_M_invoke;
  local_680 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:207:9)>
              ::_M_manager;
  local_690._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_690);
  std::_Function_base::~_Function_base((_Function_base *)&local_690);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"forceR5",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_6b0._8_8_ = 0;
  local_698 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:210:9)>
              ::_M_invoke;
  local_6a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:210:9)>
              ::_M_manager;
  local_6b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_6b0);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"check",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_6d0._8_8_ = 0;
  local_6b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:215:9)>
              ::_M_invoke;
  local_6c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:215:9)>
              ::_M_manager;
  local_6d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_6d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"checkLinearization",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_6f0._8_8_ = 0;
  local_6d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:218:9)>
              ::_M_invoke;
  local_6e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:218:9)>
              ::_M_manager;
  local_6f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_6f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_6f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"filteredStreamData",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_710._8_8_ = 0;
  local_6f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:221:9)>
              ::_M_invoke;
  local_700 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:221:9)>
              ::_M_manager;
  local_710._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_710);
  std::_Function_base::~_Function_base((_Function_base *)&local_710);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"rawStreamData",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_730._8_8_ = 0;
  local_718 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:224:9)>
              ::_M_invoke;
  local_720 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:224:9)>
              ::_M_manager;
  local_730._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_730);
  std::_Function_base::~_Function_base((_Function_base *)&local_730);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"showEncryption",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_750._8_8_ = 0;
  local_738 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:227:9)>
              ::_M_invoke;
  local_740 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:227:9)>
              ::_M_manager;
  local_750._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_750);
  std::_Function_base::~_Function_base((_Function_base *)&local_750);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"showEncryptionKey",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_770._8_8_ = 0;
  local_758 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:230:9)>
              ::_M_invoke;
  local_760 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:230:9)>
              ::_M_manager;
  local_770._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_770);
  std::_Function_base::~_Function_base((_Function_base *)&local_770);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"showLinearization",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_790._8_8_ = 0;
  local_778 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:233:9)>
              ::_M_invoke;
  local_780 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:233:9)>
              ::_M_manager;
  local_790._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_790);
  std::_Function_base::~_Function_base((_Function_base *)&local_790);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"showNpages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_7b0._8_8_ = 0;
  local_798 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:236:9)>
              ::_M_invoke;
  local_7a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:236:9)>
              ::_M_manager;
  local_7b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_7b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_7b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"showObject",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_7d0._8_8_ = 0;
  local_7b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:239:14)>
              ::_M_invoke;
  local_7c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:239:14)>
              ::_M_manager;
  local_7d0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_7d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_7d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"showPages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_7f0._8_8_ = 0;
  local_7d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:242:9)>
              ::_M_invoke;
  local_7e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:242:9)>
              ::_M_manager;
  local_7f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_7f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_7f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"showXref",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_810._8_8_ = 0;
  local_7f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:245:9)>
              ::_M_invoke;
  local_800 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:245:9)>
              ::_M_manager;
  local_810._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_810);
  std::_Function_base::~_Function_base((_Function_base *)&local_810);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"withImages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_830._8_8_ = 0;
  local_818 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:248:9)>
              ::_M_invoke;
  local_820 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:248:9)>
              ::_M_manager;
  local_830._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_830);
  std::_Function_base::~_Function_base((_Function_base *)&local_830);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"listAttachments",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_850._8_8_ = 0;
  local_838 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:251:9)>
              ::_M_invoke;
  local_840 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:251:9)>
              ::_M_manager;
  local_850._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_850);
  std::_Function_base::~_Function_base((_Function_base *)&local_850);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"showAttachment",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_870._8_8_ = 0;
  local_858 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:254:14)>
              ::_M_invoke;
  local_860 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:254:14)>
              ::_M_manager;
  local_870._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_870);
  std::_Function_base::~_Function_base((_Function_base *)&local_870);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"json",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_890._8_8_ = 0;
  local_878 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:257:41)>
              ::_M_invoke;
  local_880 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:257:41)>
              ::_M_manager;
  local_890._M_unused._M_object = this;
  addChoices(this,initHandlers::json_version_choices,false,(param_handler_t *)&local_890);
  std::_Function_base::~_Function_base((_Function_base *)&local_890);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"jsonKey",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1118,this,0x18fcf2);
  bindBare(&local_1138,this,0x18fcf4);
  beginArray(this,&local_1118,&local_1138);
  std::_Function_base::~_Function_base(&local_1138.super__Function_base);
  std::_Function_base::~_Function_base(&local_1118.super__Function_base);
  local_8b0._8_8_ = 0;
  local_898 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:261:36)>
              ::_M_invoke;
  local_8a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:261:36)>
              ::_M_manager;
  local_8b0._M_unused._M_object = this;
  addChoices(this,initHandlers::json_key_choices,true,(param_handler_t *)&local_8b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_8b0);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"jsonObject",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1158,this,0x18fcf6);
  bindBare(&local_1178,this,0x18fcf8);
  beginArray(this,&local_1158,&local_1178);
  std::_Function_base::~_Function_base(&local_1178.super__Function_base);
  std::_Function_base::~_Function_base(&local_1158.super__Function_base);
  local_8d0._8_8_ = 0;
  local_8b8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:266:14)>
              ::_M_invoke;
  local_8c0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:266:14)>
              ::_M_manager;
  local_8d0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_8d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_8d0);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"jsonStreamData",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_8f0._8_8_ = 0;
  local_8d8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:270:44)>
              ::_M_invoke;
  local_8e0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:270:44)>
              ::_M_manager;
  local_8f0._M_unused._M_object = this;
  addChoices(this,initHandlers::json_stream_data_choices,true,(param_handler_t *)&local_8f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_8f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"jsonStreamPrefix",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_910._8_8_ = 0;
  local_8f8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:273:14)>
              ::_M_invoke;
  local_900 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:273:14)>
              ::_M_manager;
  local_910._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_910);
  std::_Function_base::~_Function_base((_Function_base *)&local_910);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"updateFromJson",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_930._8_8_ = 0;
  local_918 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:276:14)>
              ::_M_invoke;
  local_920 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:276:14)>
              ::_M_manager;
  local_930._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_930);
  std::_Function_base::~_Function_base((_Function_base *)&local_930);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"allowWeakCrypto",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_950._8_8_ = 0;
  local_938 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:279:9)>
              ::_M_invoke;
  local_940 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:279:9)>
              ::_M_manager;
  local_950._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_950);
  std::_Function_base::~_Function_base((_Function_base *)&local_950);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"keepFilesOpen",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_970._8_8_ = 0;
  local_958 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:282:30)>
              ::_M_invoke;
  local_960 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:282:30)>
              ::_M_manager;
  local_970._M_unused._M_object = this;
  addChoices(this,initHandlers::yn_choices,true,(param_handler_t *)&local_970);
  std::_Function_base::~_Function_base((_Function_base *)&local_970);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"keepFilesOpenThreshold",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_990._8_8_ = 0;
  local_978 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:285:14)>
              ::_M_invoke;
  local_980 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:285:14)>
              ::_M_manager;
  local_990._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_990);
  std::_Function_base::~_Function_base((_Function_base *)&local_990);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"noWarn",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_9b0._8_8_ = 0;
  local_998 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:288:9)>
              ::_M_invoke;
  local_9a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:288:9)>
              ::_M_manager;
  local_9b0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_9b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_9b0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"verbose",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_9d0._8_8_ = 0;
  local_9b8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:291:9)>
              ::_M_invoke;
  local_9c0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:291:9)>
              ::_M_manager;
  local_9d0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_9d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_9d0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"testJsonSchema",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_9f0._8_8_ = 0;
  local_9d8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:294:9)>
              ::_M_invoke;
  local_9e0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:294:9)>
              ::_M_manager;
  local_9f0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_9f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_9f0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"ignoreXrefStreams",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_a10._8_8_ = 0;
  local_9f8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:297:9)>
              ::_M_invoke;
  local_a00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:297:9)>
              ::_M_manager;
  local_a10._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a10);
  std::_Function_base::~_Function_base((_Function_base *)&local_a10);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"passwordIsHexKey",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_a30._8_8_ = 0;
  local_a18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:300:9)>
              ::_M_invoke;
  local_a20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:300:9)>
              ::_M_manager;
  local_a30._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a30);
  std::_Function_base::~_Function_base((_Function_base *)&local_a30);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"passwordMode",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_a50._8_8_ = 0;
  local_a38 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:303:41)>
              ::_M_invoke;
  local_a40 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:303:41)>
              ::_M_manager;
  local_a50._M_unused._M_object = this;
  addChoices(this,initHandlers::password_mode_choices,true,(param_handler_t *)&local_a50);
  std::_Function_base::~_Function_base((_Function_base *)&local_a50);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"suppressPasswordRecovery",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_a70._8_8_ = 0;
  local_a58 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:306:9)>
              ::_M_invoke;
  local_a60 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:306:9)>
              ::_M_manager;
  local_a70._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a70);
  std::_Function_base::~_Function_base((_Function_base *)&local_a70);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"suppressRecovery",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_a90._8_8_ = 0;
  local_a78 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:309:9)>
              ::_M_invoke;
  local_a80 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:309:9)>
              ::_M_manager;
  local_a90._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_a90);
  std::_Function_base::~_Function_base((_Function_base *)&local_a90);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"coalesceContents",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_ab0._8_8_ = 0;
  local_a98 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:312:9)>
              ::_M_invoke;
  local_aa0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:312:9)>
              ::_M_manager;
  local_ab0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_ab0);
  std::_Function_base::~_Function_base((_Function_base *)&local_ab0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"compressionLevel",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_ad0._8_8_ = 0;
  local_ab8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:315:14)>
              ::_M_invoke;
  local_ac0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:315:14)>
              ::_M_manager;
  local_ad0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_ad0);
  std::_Function_base::~_Function_base((_Function_base *)&local_ad0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"jpegQuality",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_af0._8_8_ = 0;
  local_ad8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:318:14)>
              ::_M_invoke;
  local_ae0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:318:14)>
              ::_M_manager;
  local_af0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_af0);
  std::_Function_base::~_Function_base((_Function_base *)&local_af0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"externalizeInlineImages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_b10._8_8_ = 0;
  local_af8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:321:9)>
              ::_M_invoke;
  local_b00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:321:9)>
              ::_M_manager;
  local_b10._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_b10);
  std::_Function_base::~_Function_base((_Function_base *)&local_b10);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"iiMinBytes",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_b30._8_8_ = 0;
  local_b18 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:324:14)>
              ::_M_invoke;
  local_b20 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:324:14)>
              ::_M_manager;
  local_b30._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_b30);
  std::_Function_base::~_Function_base((_Function_base *)&local_b30);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"removeUnreferencedResources",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_b50._8_8_ = 0;
  local_b38 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:327:40)>
              ::_M_invoke;
  local_b40 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:327:40)>
              ::_M_manager;
  local_b50._M_unused._M_object = this;
  addChoices(this,initHandlers::remove_unref_choices,true,(param_handler_t *)&local_b50);
  std::_Function_base::~_Function_base((_Function_base *)&local_b50);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"addAttachment",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1198,this,0x18fcfa);
  bindBare(&local_11b8,this,0x18fcfc);
  beginArray(this,&local_1198,&local_11b8);
  std::_Function_base::~_Function_base(&local_11b8.super__Function_base);
  std::_Function_base::~_Function_base(&local_1198.super__Function_base);
  bindJSON(&local_11d8,this,0x18fcfe);
  bindBare(&local_11f8,this,0x18fd3a);
  beginDict(this,&local_11d8,&local_11f8);
  std::_Function_base::~_Function_base(&local_11f8.super__Function_base);
  std::_Function_base::~_Function_base(&local_11d8.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"file",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:420:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:420:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"creationdate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_b70._8_8_ = 0;
  local_b58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:336:14)>
              ::_M_invoke;
  local_b60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:336:14)>
              ::_M_manager;
  local_b70._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_b70);
  std::_Function_base::~_Function_base((_Function_base *)&local_b70);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"description",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_b90._8_8_ = 0;
  local_b78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:339:14)>
              ::_M_invoke;
  local_b80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:339:14)>
              ::_M_manager;
  local_b90._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_b90);
  std::_Function_base::~_Function_base((_Function_base *)&local_b90);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"filename",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_bb0._8_8_ = 0;
  local_b98 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:342:14)>
              ::_M_invoke;
  local_ba0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:342:14)>
              ::_M_manager;
  local_bb0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_bb0);
  std::_Function_base::~_Function_base((_Function_base *)&local_bb0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"key",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_bd0._8_8_ = 0;
  local_bb8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:345:14)>
              ::_M_invoke;
  local_bc0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:345:14)>
              ::_M_manager;
  local_bd0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_bd0);
  std::_Function_base::~_Function_base((_Function_base *)&local_bd0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"mimetype",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_bf0._8_8_ = 0;
  local_bd8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:348:14)>
              ::_M_invoke;
  local_be0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:348:14)>
              ::_M_manager;
  local_bf0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_bf0);
  std::_Function_base::~_Function_base((_Function_base *)&local_bf0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"moddate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_c10._8_8_ = 0;
  local_bf8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:351:14)>
              ::_M_invoke;
  local_c00 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:351:14)>
              ::_M_manager;
  local_c10._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c10);
  std::_Function_base::~_Function_base((_Function_base *)&local_c10);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"replace",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_c30._8_8_ = 0;
  local_c18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:354:9)>
              ::_M_invoke;
  local_c20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:354:9)>
              ::_M_manager;
  local_c30._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_c30);
  std::_Function_base::~_Function_base((_Function_base *)&local_c30);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"removeAttachment",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1218,this,0x18fd70);
  bindBare(&local_1238,this,0x18fd72);
  beginArray(this,&local_1218,&local_1238);
  std::_Function_base::~_Function_base(&local_1238.super__Function_base);
  std::_Function_base::~_Function_base(&local_1218.super__Function_base);
  local_c50._8_8_ = 0;
  local_c38 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:360:14)>
              ::_M_invoke;
  local_c40 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:360:14)>
              ::_M_manager;
  local_c50._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c50);
  std::_Function_base::~_Function_base((_Function_base *)&local_c50);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"copyAttachmentsFrom",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1258,this,0x18fd74);
  bindBare(&local_1278,this,0x18fd76);
  beginArray(this,&local_1258,&local_1278);
  std::_Function_base::~_Function_base(&local_1278.super__Function_base);
  std::_Function_base::~_Function_base(&local_1258.super__Function_base);
  bindJSON(&local_1298,this,0x18fd78);
  bindBare(&local_12b8,this,0x18fdb4);
  beginDict(this,&local_1298,&local_12b8);
  std::_Function_base::~_Function_base(&local_12b8.super__Function_base);
  std::_Function_base::~_Function_base(&local_1298.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"file",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:462:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:462:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"password",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:468:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:468:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"prefix",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_c70._8_8_ = 0;
  local_c58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:373:14)>
              ::_M_invoke;
  local_c60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:373:14)>
              ::_M_manager;
  local_c70._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c70);
  std::_Function_base::~_Function_base((_Function_base *)&local_c70);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"collate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_c90._8_8_ = 0;
  local_c78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:378:14)>
              ::_M_invoke;
  local_c80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:378:14)>
              ::_M_manager;
  local_c90._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_c90);
  std::_Function_base::~_Function_base((_Function_base *)&local_c90);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"flattenAnnotations",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_cb0._8_8_ = 0;
  local_c98 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:381:35)>
              ::_M_invoke;
  local_ca0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:381:35)>
              ::_M_manager;
  local_cb0._M_unused._M_object = this;
  addChoices(this,initHandlers::flatten_choices,true,(param_handler_t *)&local_cb0);
  std::_Function_base::~_Function_base((_Function_base *)&local_cb0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"flattenRotation",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_cd0._8_8_ = 0;
  local_cb8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:384:9)>
              ::_M_invoke;
  local_cc0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:384:9)>
              ::_M_manager;
  local_cd0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_cd0);
  std::_Function_base::~_Function_base((_Function_base *)&local_cd0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"generateAppearances",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_cf0._8_8_ = 0;
  local_cd8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:387:9)>
              ::_M_invoke;
  local_ce0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:387:9)>
              ::_M_manager;
  local_cf0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_cf0);
  std::_Function_base::~_Function_base((_Function_base *)&local_cf0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"keepInlineImages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_d10._8_8_ = 0;
  local_cf8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:390:9)>
              ::_M_invoke;
  local_d00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:390:9)>
              ::_M_manager;
  local_d10._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d10);
  std::_Function_base::~_Function_base((_Function_base *)&local_d10);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"oiMinArea",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_d30._8_8_ = 0;
  local_d18 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:393:14)>
              ::_M_invoke;
  local_d20 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:393:14)>
              ::_M_manager;
  local_d30._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_d30);
  std::_Function_base::~_Function_base((_Function_base *)&local_d30);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"oiMinHeight",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_d50._8_8_ = 0;
  local_d38 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:396:14)>
              ::_M_invoke;
  local_d40 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:396:14)>
              ::_M_manager;
  local_d50._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_d50);
  std::_Function_base::~_Function_base((_Function_base *)&local_d50);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"oiMinWidth",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_d70._8_8_ = 0;
  local_d58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:399:14)>
              ::_M_invoke;
  local_d60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:399:14)>
              ::_M_manager;
  local_d70._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_d70);
  std::_Function_base::~_Function_base((_Function_base *)&local_d70);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"optimizeImages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_d90._8_8_ = 0;
  local_d78 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:402:9)>
              ::_M_invoke;
  local_d80 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:402:9)>
              ::_M_manager;
  local_d90._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_d90);
  std::_Function_base::~_Function_base((_Function_base *)&local_d90);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"pages",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_12d8,this,0x18fdea);
  bindBare(&local_12f8,this,0x18fe26);
  beginArray(this,&local_12d8,&local_12f8);
  std::_Function_base::~_Function_base(&local_12f8.super__Function_base);
  std::_Function_base::~_Function_base(&local_12d8.super__Function_base);
  bindJSON(&local_1318,this,0x18fe5c);
  bindBare(&local_1338,this,0x18ff48);
  beginDict(this,&local_1318,&local_1338);
  std::_Function_base::~_Function_base(&local_1338.super__Function_base);
  std::_Function_base::~_Function_base(&local_1318.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"file",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  ignoreItem(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"password",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:511:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:511:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"range",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_db0._8_8_ = 0;
  local_d98 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:414:14)>
              ::_M_invoke;
  local_da0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:414:14)>
              ::_M_manager;
  local_db0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_db0);
  std::_Function_base::~_Function_base((_Function_base *)&local_db0);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"removeInfo",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_dd0._8_8_ = 0;
  local_db8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:419:9)>
              ::_M_invoke;
  local_dc0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:419:9)>
              ::_M_manager;
  local_dd0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_dd0);
  std::_Function_base::~_Function_base((_Function_base *)&local_dd0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"removeMetadata",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_df0._8_8_ = 0;
  local_dd8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:422:9)>
              ::_M_invoke;
  local_de0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:422:9)>
              ::_M_manager;
  local_df0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_df0);
  std::_Function_base::~_Function_base((_Function_base *)&local_df0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"removePageLabels",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_e10._8_8_ = 0;
  local_df8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:425:9)>
              ::_M_invoke;
  local_e00 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:425:9)>
              ::_M_manager;
  local_e10._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e10);
  std::_Function_base::~_Function_base((_Function_base *)&local_e10);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"removeStructure",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_e30._8_8_ = 0;
  local_e18 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:428:9)>
              ::_M_invoke;
  local_e20 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:428:9)>
              ::_M_manager;
  local_e30._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e30);
  std::_Function_base::~_Function_base((_Function_base *)&local_e30);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"reportMemoryUsage",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_e50._8_8_ = 0;
  local_e38 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:431:9)>
              ::_M_invoke;
  local_e40 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:431:9)>
              ::_M_manager;
  local_e50._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_e50);
  std::_Function_base::~_Function_base((_Function_base *)&local_e50);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"rotate",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1358,this,0x18ff4a);
  bindBare(&local_1378,this,0x18ff4c);
  beginArray(this,&local_1358,&local_1378);
  std::_Function_base::~_Function_base(&local_1378.super__Function_base);
  std::_Function_base::~_Function_base(&local_1358.super__Function_base);
  local_e70._8_8_ = 0;
  local_e58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:435:14)>
              ::_M_invoke;
  local_e60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:435:14)>
              ::_M_manager;
  local_e70._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_e70);
  std::_Function_base::~_Function_base((_Function_base *)&local_e70);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"setPageLabels",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1398,this,0x18ff4e);
  bindBare(&local_13b8,this,0x18ff50);
  beginArray(this,&local_1398,&local_13b8);
  std::_Function_base::~_Function_base(&local_13b8.super__Function_base);
  std::_Function_base::~_Function_base(&local_1398.super__Function_base);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->accumulated_args);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:608:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:608:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"overlay",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_13d8,this,0x18ff70);
  bindBare(&local_13f8,this,0x18ff72);
  beginArray(this,&local_13d8,&local_13f8);
  std::_Function_base::~_Function_base(&local_13f8.super__Function_base);
  std::_Function_base::~_Function_base(&local_13d8.super__Function_base);
  bindJSON(&local_1418,this,0x18ff74);
  bindBare(&local_1438,this,0x18ffbe);
  beginDict(this,&local_1418,&local_1438);
  std::_Function_base::~_Function_base(&local_1438.super__Function_base);
  std::_Function_base::~_Function_base(&local_1418.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"file",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  ignoreItem(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"password",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:550:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:550:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"from",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_e90._8_8_ = 0;
  local_e78 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:453:14)>
              ::_M_invoke;
  local_e80 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:453:14)>
              ::_M_manager;
  local_e90._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_e90);
  std::_Function_base::~_Function_base((_Function_base *)&local_e90);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"repeat",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_eb0._8_8_ = 0;
  local_e98 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:456:14)>
              ::_M_invoke;
  local_ea0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:456:14)>
              ::_M_manager;
  local_eb0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_eb0);
  std::_Function_base::~_Function_base((_Function_base *)&local_eb0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"to",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_ed0._8_8_ = 0;
  local_eb8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:459:14)>
              ::_M_invoke;
  local_ec0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:459:14)>
              ::_M_manager;
  local_ed0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_ed0);
  std::_Function_base::~_Function_base((_Function_base *)&local_ed0);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"underlay",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  bindJSON(&local_1458,this,0x18fff4);
  bindBare(&local_1478,this,0x18fff6);
  beginArray(this,&local_1458,&local_1478);
  std::_Function_base::~_Function_base(&local_1478.super__Function_base);
  std::_Function_base::~_Function_base(&local_1458.super__Function_base);
  bindJSON(&local_1498,this,0x18fff8);
  bindBare(&local_14b8,this,0x190042);
  beginDict(this,&local_1498,&local_14b8);
  std::_Function_base::~_Function_base(&local_14b8.super__Function_base);
  std::_Function_base::~_Function_base(&local_1498.super__Function_base);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"file",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  ignoreItem(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"password",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_14d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_14c0 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:589:18)>
               ::_M_invoke;
  local_14c8 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:589:18)>
               ::_M_manager;
  local_14d8._0_8_ = this;
  addParameter(this,(param_handler_t *)local_14d8);
  std::_Function_base::~_Function_base((_Function_base *)local_14d8);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"from",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_ef0._8_8_ = 0;
  local_ed8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:473:14)>
              ::_M_invoke;
  local_ee0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:473:14)>
              ::_M_manager;
  local_ef0._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_ef0);
  std::_Function_base::~_Function_base((_Function_base *)&local_ef0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"repeat",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_f10._8_8_ = 0;
  local_ef8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:476:14)>
              ::_M_invoke;
  local_f00 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:476:14)>
              ::_M_manager;
  local_f10._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_f10);
  std::_Function_base::~_Function_base((_Function_base *)&local_f10);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"to",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_f30._8_8_ = 0;
  local_f18 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:479:14)>
              ::_M_invoke;
  local_f20 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:479:14)>
              ::_M_manager;
  local_f30._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_f30);
  std::_Function_base::~_Function_base((_Function_base *)&local_f30);
  popHandler(this);
  popHandler(this);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"warningExit0",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_f50._8_8_ = 0;
  local_f38 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:484:9)>
              ::_M_invoke;
  local_f40 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:484:9)>
              ::_M_manager;
  local_f50._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_f50);
  std::_Function_base::~_Function_base((_Function_base *)&local_f50);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"jobJsonFile",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_f70._8_8_ = 0;
  local_f58 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:487:14)>
              ::_M_invoke;
  local_f60 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:487:14)>
              ::_M_manager;
  local_f70._M_unused._M_object = this;
  addParameter(this,(param_handler_t *)&local_f70);
  std::_Function_base::~_Function_base((_Function_base *)&local_f70);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"preserveUnreferencedResources",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_f90._8_8_ = 0;
  local_f78 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:490:9)>
              ::_M_invoke;
  local_f80 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:490:9)>
              ::_M_manager;
  local_f90._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_f90);
  std::_Function_base::~_Function_base((_Function_base *)&local_f90);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_14d8,"requiresPassword",&local_14d9);
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_fb0._8_8_ = 0;
  local_f98 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:493:9)>
              ::_M_invoke;
  local_fa0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:493:9)>
              ::_M_manager;
  local_fb0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_fb0);
  std::_Function_base::~_Function_base((_Function_base *)&local_fb0);
  popHandler(this);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_14d8,"isEncrypted",&local_14d9)
  ;
  pushKey(this,(string *)local_14d8);
  std::__cxx11::string::~string((string *)local_14d8);
  local_fd0._8_8_ = 0;
  local_fb8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:496:9)>
              ::_M_invoke;
  local_fc0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf/auto_job_json_init.hh:496:9)>
              ::_M_manager;
  local_fd0._M_unused._M_object = this;
  addBare(this,(bare_handler_t *)&local_fd0);
  std::_Function_base::~_Function_base((_Function_base *)&local_fd0);
  popHandler(this);
  if ((long)(this->json_handlers).
            super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->json_handlers).
            super__Vector_base<std::shared_ptr<JSONHandler>,_std::allocator<std::shared_ptr<JSONHandler>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x10) {
    return;
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"QPDFJob_json: json_handlers size != 1 at end");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
Handlers::initHandlers()
{
    this->json_handlers.emplace_back(std::make_shared<JSONHandler>());
    this->jh = this->json_handlers.back().get();
    jh->addDictHandlers(
        [](std::string const&, JSON) {},
        [this](std::string const&) {
            if (!this->partial) {
                c_main->checkConfiguration();
            }
        });

#include <qpdf/auto_job_json_init.hh>

    // We have `bits` in the CLI but not in the JSON. Reference this variable so it doesn't generate
    // a warning.
    [](char const**) {}(enc_bits_choices);

    if (this->json_handlers.size() != 1) {
        throw std::logic_error("QPDFJob_json: json_handlers size != 1 at end");
    }
}